

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool wallet::HaveKey(SigningProvider *wallet,CKey *key)

{
  undefined1 uVar1;
  byte bVar2;
  CKey *this;
  long *in_RDI;
  long in_FS_OFFSET;
  CKey key2;
  CKey *in_stack_fffffffffffffed8;
  CKey *in_stack_fffffffffffffee8;
  byte local_10a;
  undefined1 in_stack_fffffffffffffef7;
  byte *in_stack_fffffffffffffef8;
  long *plVar3;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 local_71 [85];
  undefined1 local_1c [20];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CKey::CKey(in_stack_fffffffffffffed8);
  CKey::begin(in_stack_fffffffffffffed8);
  this = (CKey *)CKey::end(in_stack_fffffffffffffee8);
  uVar1 = CKey::IsCompressed(in_stack_fffffffffffffed8);
  CKey::Set<std::byte_const*>
            (this,(byte *)CONCAT17(uVar1,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8,
             (bool)in_stack_fffffffffffffef7);
  plVar3 = in_RDI;
  CKey::GetPubKey((CKey *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
  CPubKey::GetID((CPubKey *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
  bVar2 = (**(code **)(*plVar3 + 0x30))(plVar3,local_1c);
  local_10a = 1;
  if ((bVar2 & 1) == 0) {
    CKey::GetPubKey((CKey *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
    CPubKey::GetID((CPubKey *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
    local_10a = (**(code **)(*in_RDI + 0x30))(in_RDI,local_71);
  }
  CKey::~CKey(in_stack_fffffffffffffed8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_10a & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool HaveKey(const SigningProvider& wallet, const CKey& key)
{
    CKey key2;
    key2.Set(key.begin(), key.end(), !key.IsCompressed());
    return wallet.HaveKey(key.GetPubKey().GetID()) || wallet.HaveKey(key2.GetPubKey().GetID());
}